

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O2

void __thiscall efsw::FileWatcherGeneric::~FileWatcherGeneric(FileWatcherGeneric *this)

{
  pointer ppWVar1;
  
  (this->super_FileWatcherImpl)._vptr_FileWatcherImpl =
       (_func_int **)&PTR__FileWatcherGeneric_0011dac0;
  (this->super_FileWatcherImpl).mInitOK.set_._M_base._M_i = false;
  if (this->mThread != (Thread *)0x0) {
    (*this->mThread->_vptr_Thread[1])();
    this->mThread = (Thread *)0x0;
  }
  for (ppWVar1 = (this->mWatches).
                 super__Vector_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppWVar1 !=
      (this->mWatches).
      super__Vector_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppWVar1 = ppWVar1 + 1) {
    if (*ppWVar1 != (WatcherGeneric *)0x0) {
      (*((*ppWVar1)->super_Watcher)._vptr_Watcher[1])();
      *ppWVar1 = (WatcherGeneric *)0x0;
    }
  }
  Mutex::~Mutex(&this->mWatchesLock);
  std::_Vector_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>::~_Vector_base
            (&(this->mWatches).
              super__Vector_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>);
  FileWatcherImpl::~FileWatcherImpl(&this->super_FileWatcherImpl);
  return;
}

Assistant:

FileWatcherGeneric::~FileWatcherGeneric() {
	mInitOK = false;

	efSAFE_DELETE( mThread );

	/// Delete the watches
	WatchList::iterator it = mWatches.begin();

	for ( ; it != mWatches.end(); ++it ) {
		efSAFE_DELETE( ( *it ) );
	}
}